

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int float128_compare_quiet_ppc64(float128 a,float128 b,float_status *status)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = b.high;
  uVar4 = b.low;
  uVar5 = a.high;
  uVar6 = a.low;
  if ((((~uVar5 & 0x7fff000000000000) == 0) &&
      (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar6 != 0)) ||
     (((~uVar3 & 0x7fff000000000000) == 0 &&
      (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
       uVar4 != 0)))) {
    if ((((uVar5 & 0x7fff800000000000) == 0x7fff000000000000) &&
        (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar6 != 0)) ||
       ((iVar1 = 2, (uVar3 & 0x7fff800000000000) == 0x7fff000000000000 &&
        (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
         uVar4 != 0)))) {
      status->float_exception_flags = status->float_exception_flags | 1;
      return 2;
    }
  }
  else {
    if (uVar5 >> 0x3f == uVar3 >> 0x3f) {
      if (uVar5 == uVar3 && uVar6 == uVar4) {
        return 0;
      }
      uVar2 = (uint)(byte)(((uVar6 < uVar4 && uVar5 == uVar3 || uVar5 < uVar3) ^ a.high._7_1_ >> 7)
                          * '\x02');
    }
    else {
      if ((((uVar3 | uVar5) & 0x7fffffffffffffff) == 0 && uVar6 == 0) && uVar4 == 0) {
        return 0;
      }
      uVar2 = (a.high._4_4_ >> 0x1f) * -2 & 0xff;
    }
    iVar1 = 1 - uVar2;
  }
  return iVar1;
}

Assistant:

int float128_compare_quiet(float128 a, float128 b, float_status *status)
{
    return float128_compare_internal(a, b, 1, status);
}